

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O0

Entity avro::json::readEntity(JsonParser *p)

{
  Token TVar1;
  domain_error *this;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  placeholder *extraout_RDX;
  placeholder *extraout_RDX_00;
  placeholder *extraout_RDX_01;
  placeholder *extraout_RDX_02;
  placeholder *extraout_RDX_03;
  placeholder *extraout_RDX_04;
  placeholder *extraout_RDX_05;
  any aVar3;
  JsonParser *in_RSI;
  undefined8 in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Entity>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Entity EVar5;
  Entity n;
  string k;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  v_1;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> v;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  JsonParser *in_stack_fffffffffffffeb0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
  *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  string local_a0 [32];
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  local_80 [2];
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> local_60 [2];
  string local_40 [40];
  JsonParser *in_stack_ffffffffffffffe8;
  
  TVar1 = JsonParser::peek(in_stack_fffffffffffffeb0);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)TVar1;
  switch(args) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    Entity::Entity((Entity *)0x2b5aad);
    aVar3.content = extraout_RDX;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    JsonParser::boolValue(in_RSI);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,(Bool)in_stack_fffffffffffffeaf);
    aVar3.content = extraout_RDX_00;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    JsonParser::longValue(in_RSI);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,
                   CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    aVar3.content = extraout_RDX_01;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    JsonParser::doubleValue(in_RSI);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,
                   (Double)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    aVar3.content = extraout_RDX_02;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    JsonParser::stringValue_abi_cxx11_
              ((JsonParser *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    boost::make_shared<std::__cxx11::string,std::__cxx11::string>(args);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,
                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2b5b92);
    std::__cxx11::string::~string(local_40);
    aVar3.content = extraout_RDX_03;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    boost::make_shared<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>();
    while (TVar1 = JsonParser::peek(in_stack_fffffffffffffeb0), TVar1 != tkArrayEnd) {
      boost::shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>::
      operator->(local_60);
      readEntity(in_stack_ffffffffffffffe8);
      std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>::push_back
                ((vector<avro::json::Entity,_std::allocator<avro::json::Entity>_> *)
                 in_stack_fffffffffffffeb0,
                 (value_type *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      Entity::~Entity((Entity *)0x2b5c71);
    }
    JsonParser::advance(in_stack_fffffffffffffeb0);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,
                   (shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    boost::shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_>::
    ~shared_ptr((shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> *
                )0x2b5cdc);
    aVar3.content = extraout_RDX_04;
    break;
  default:
    this = (domain_error *)__cxa_allocate_exception(0x10);
    TVar1 = JsonParser::peek(in_stack_fffffffffffffeb0);
    pcVar2 = JsonParser::toString(TVar1);
    std::domain_error::domain_error(this,pcVar2);
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    JsonParser::advance(in_stack_fffffffffffffeb0);
    boost::
    make_shared<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>
              ();
    while (TVar1 = JsonParser::peek(in_stack_fffffffffffffeb0), TVar1 != tkObjectEnd) {
      JsonParser::advance(in_stack_fffffffffffffeb0);
      JsonParser::stringValue_abi_cxx11_
                ((JsonParser *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      readEntity(in_stack_ffffffffffffffe8);
      boost::
      shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
      ::operator->(local_80);
      std::make_pair<std::__cxx11::string&,avro::json::Entity&>
                (&in_stack_fffffffffffffeb8->first,(Entity *)in_stack_fffffffffffffeb0);
      _Var4 = std::
              map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>
              ::insert<std::pair<std::__cxx11::string,avro::json::Entity>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec4 = CONCAT13(_Var4.second,(int3)in_stack_fffffffffffffec4);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>
               *)in_stack_fffffffffffffeb0);
      Entity::~Entity((Entity *)0x2b5ddb);
      std::__cxx11::string::~string(local_a0);
    }
    JsonParser::advance(in_stack_fffffffffffffeb0);
    Entity::Entity((Entity *)in_stack_fffffffffffffeb0,
                   (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    boost::
    shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
                   *)0x2b5e9c);
    aVar3.content = extraout_RDX_05;
  }
  EVar5.value_.content = aVar3.content;
  EVar5._0_8_ = in_RDI;
  return EVar5;
}

Assistant:

Entity readEntity(JsonParser& p)
{
    switch (p.peek()) {
    case JsonParser::tkNull:
        p.advance();
        return Entity();
    case JsonParser::tkBool:
        p.advance();
        return Entity(p.boolValue());
    case JsonParser::tkLong:
        p.advance();
        return Entity(p.longValue());
    case JsonParser::tkDouble:
        p.advance();
        return Entity(p.doubleValue());
    case JsonParser::tkString:
        p.advance();
        return Entity(boost::make_shared<String>(p.stringValue()));
    case JsonParser::tkArrayStart:
        {
            p.advance();
            boost::shared_ptr<Array> v = boost::make_shared<Array>();
            while (p.peek() != JsonParser::tkArrayEnd) {
                v->push_back(readEntity(p));
            }
            p.advance();
            return Entity(v);
        }
    case JsonParser::tkObjectStart:
        {
            p.advance();
            boost::shared_ptr<Object> v = boost::make_shared<Object>();
            while (p.peek() != JsonParser::tkObjectEnd) {
                p.advance();
                std::string k = p.stringValue();
                Entity n = readEntity(p);
                v->insert(std::make_pair(k, n));
            }
            p.advance();
            return Entity(v);
        }
    default:
        throw std::domain_error(JsonParser::toString(p.peek()));
    }
    
}